

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Vec_Ptr_t * Aig_ManRegPartitionSimple(Aig_Man_t *pAig,int nPartSize,int nOverSize)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *p;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int Entry;
  ulong local_50;
  
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,nPartSize);
    puts("Adjusting it to be equal to half of the partition size.");
    nOverSize = nPartSize / 2;
  }
  if (nPartSize <= nOverSize) {
    __assert_fail("nOverSize < nPartSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                  ,0x1e5,"Vec_Ptr_t *Aig_ManRegPartitionSimple(Aig_Man_t *, int, int)");
  }
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  if (0 < pAig->nRegs) {
    iVar6 = 0x10;
    if (0xe < nPartSize - 1U) {
      iVar6 = nPartSize;
    }
    iVar5 = 0;
    local_50 = 100;
    Entry = 0;
    do {
      p = (Vec_Int_t *)malloc(0x10);
      p->nSize = 0;
      p->nCap = iVar6;
      if (iVar6 == 0) {
        piVar3 = (int *)0x0;
      }
      else {
        piVar3 = (int *)malloc((long)iVar6 << 2);
      }
      p->pArray = piVar3;
      iVar7 = nPartSize;
      if (nPartSize < 1) {
        iVar7 = 0;
      }
      else {
        do {
          if (Entry < pAig->nRegs) {
            Vec_IntPush(p,Entry);
          }
          Entry = Entry + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar7 = p->nSize;
      }
      if (nOverSize < iVar7) {
        iVar7 = (int)local_50;
        if (iVar5 == iVar7) {
          if (iVar7 < 0x10) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = 0x10;
            local_50 = 0x10;
          }
          else {
            local_50 = (ulong)(uint)(iVar7 * 2);
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar2 = (void **)malloc(local_50 * 8);
            }
            else {
              ppvVar2 = (void **)realloc(pVVar1->pArray,local_50 * 8);
            }
            pVVar1->pArray = ppvVar2;
            pVVar1->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar2 = pVVar1->pArray;
        }
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pVVar1->nSize = iVar5;
        ppvVar2[lVar4] = p;
      }
      else {
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
      }
      Entry = Entry - nOverSize;
    } while (Entry < pAig->nRegs);
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSimple( Aig_Man_t * pAig, int nPartSize, int nOverSize )
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, Counter;
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    vResult = Vec_PtrAlloc( 100 );
    for ( Counter = 0; Counter < Aig_ManRegNum(pAig); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Aig_ManRegNum(pAig) )
                Vec_IntPush( vPart, Counter );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
    return vResult;
}